

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O1

int __thiscall Fl_Input::kf_delete_eol(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  
  if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
    iVar2 = (this->super_Fl_Input_).position_;
    iVar1 = (this->super_Fl_Input_).mark_;
    if (iVar1 != iVar2) {
      iVar2 = Fl_Input_::replace(&this->super_Fl_Input_,iVar2,iVar1,(char *)0x0,0);
      return iVar2;
    }
    iVar1 = Fl_Input_::line_end(&this->super_Fl_Input_,iVar2);
    Fl_Input_::replace(&this->super_Fl_Input_,iVar2,iVar1,(char *)0x0,0);
  }
  else {
    fl_beep(0);
  }
  return 1;
}

Assistant:

int Fl_Input::kf_delete_eol() {
  if (readonly()) { fl_beep(); return 1; }
  if (mark() != position()) return cut();
  cut(position(), line_end(position()));
  return 1;
}